

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.h
# Opt level: O0

void GotoMission(int id)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char local_128 [8];
  char line [256];
  char *r;
  int ival;
  int i;
  int cur;
  int id_local;
  
  ival = 0;
  r._4_4_ = 0;
  r._0_4_ = 0;
  i = id;
  EnterCriticalSection(&MissionFilesCS);
  if ((bMissionRunning == 0) && (missionfile == (FILE *)0x0)) {
    printf("Cannot use goto outside a mission file.\n");
    LeaveCriticalSection(&MissionFilesCS);
  }
  else if ((i < 0) || (0x3ff < i)) {
    printf("Invalid parameter.\n");
    LeaveCriticalSection(&MissionFilesCS);
  }
  else {
    if (labels[i] < 1) {
      lVar2 = ftell((FILE *)missionfile);
      ival = (int)lVar2;
      rewind((FILE *)missionfile);
      do {
        while( true ) {
          while( true ) {
            do {
              pcVar3 = fgets(local_128,0x100,(FILE *)missionfile);
              if (pcVar3 == (char *)0x0) {
                printf("goto failed : label not found.\n");
                clearerr((FILE *)missionfile);
                iVar1 = fseek((FILE *)missionfile,(long)ival,0);
                if (iVar1 != 0) {
                  printf("File error.\n");
                }
                goto LAB_00143c0b;
              }
              r._4_4_ = r._4_4_ + 1;
              iVar1 = __isoc99_sscanf(local_128,"label %d",&r);
            } while (iVar1 != 1);
            if ((-1 < (int)(uint)r) && ((int)(uint)r < 0x400)) break;
            printf("Invalid parameter.\n");
          }
          if (labels[(int)(uint)r] < 1) break;
          if (labels[(int)(uint)r] != r._4_4_ + 1) {
            printf("Label %d already exists.\n",(ulong)(uint)r);
          }
        }
        labels[(int)(uint)r] = r._4_4_ + 1;
      } while ((uint)r != i);
    }
    else {
      iVar1 = fsetline(missionfile,labels[i]);
      if (iVar1 != 0) {
        printf("goto failed.\n");
      }
    }
LAB_00143c0b:
    LeaveCriticalSection(&MissionFilesCS);
  }
  return;
}

Assistant:

inline void GotoMission(int id)
{
	int cur = 0, i = 0, ival = 0;
	char* r = NULL;
	char line[MAX_BUF_LEN];

	EnterCriticalSection(&MissionFilesCS);
	if ((!bMissionRunning)&&(!missionfile))
	{
		printf("Cannot use goto outside a mission file.\n");
		LeaveCriticalSection(&MissionFilesCS);
		return;
	}
	if ((id < 0)||(id >= MAX_NB_LABELS))
	{
		printf("Invalid parameter.\n");
		LeaveCriticalSection(&MissionFilesCS);
		return;
	}
	if (labels[id] > 0) 
	{
		// Go to the next line after the label.
		if (fsetline(missionfile, labels[id]) != EXIT_SUCCESS)
		{
			printf("goto failed.\n");
		}
	}
	else
	{
		// Need to search for the label.

		cur = ftell(missionfile);
		rewind(missionfile);

		for (;;)
		{
			r = fgets(line, sizeof(line), missionfile);
			if (r == NULL) 
			{
				printf("goto failed : label not found.\n");
				clearerr(missionfile);
				// Go back to initial position.
				if (fseek(missionfile, cur, SEEK_SET) != EXIT_SUCCESS)
				{
					printf("File error.\n");
				}
				break;
			}
			i++;
			if (sscanf(line, "label %d", &ival) == 1)
			{
				if ((ival < 0)||(ival >= MAX_NB_LABELS))
				{
					printf("Invalid parameter.\n");
					continue;
				}
				if (labels[ival] > 0) 
				{
					if (labels[ival] != i+1)
					{
						printf("Label %d already exists.\n", ival);
						continue;
					}
				}
				else 
				{
					labels[ival] = i+1;
					if (ival == id) break;
				}
			}
		}
	}
	LeaveCriticalSection(&MissionFilesCS);
}